

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int add_pattr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_union value)

{
  uchar *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 uVar5;
  int_attr_struct *piVar6;
  attr_p paVar7;
  long lVar8;
  ulong uVar9;
  
  if (val_type == Attr_Int4) {
    piVar6 = (list->l).list.iattrs;
    uVar9 = (ulong)piVar6->int_attr_count;
    if (uVar9 != 0) {
      piVar6 = (int_attr_struct *)realloc(piVar6,uVar9 * 8 + 0x1c);
      (list->l).lists.lists = (attr_list *)piVar6;
    }
    for (; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
      iVar4 = piVar6->iattr[uVar9 - 1].attr_id;
      if (iVar4 <= attr_id) goto LAB_00104721;
      piVar6->iattr[uVar9].attr_id = iVar4;
      piVar6 = (list->l).list.iattrs;
      piVar6->iattr[uVar9].value = piVar6->iattr[uVar9 - 1].value;
      piVar6 = (int_attr_struct *)(list->l).lists.lists;
    }
    uVar9 = 0;
LAB_00104721:
    piVar6->iattr[uVar9 & 0xffffffff].attr_id = attr_id;
    ((list->l).list.iattrs)->iattr[uVar9 & 0xffffffff].value = (int4)value.u.f;
    puVar1 = &((list->l).list.iattrs)->int_attr_count;
    *puVar1 = *puVar1 + '\x01';
  }
  else {
    uVar9 = (ulong)((list->l).list.iattrs)->other_attr_count;
    if (uVar9 == 0) {
      paVar7 = (attr_p)malloc(0x18);
    }
    else {
      paVar7 = (attr_p)realloc((list->l).list.attributes,uVar9 * 0x18 + 0x18);
    }
    (list->l).list.attributes = paVar7;
    lVar8 = uVar9 * 0x18;
    for (; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
      iVar4 = *(int *)((long)&paVar7[-1].attr_id + lVar8);
      if (iVar4 <= attr_id) goto LAB_00104788;
      *(int *)((long)&paVar7->attr_id + lVar8) = iVar4;
      paVar7 = (list->l).list.attributes;
      *(undefined4 *)((long)&paVar7->val_type + lVar8) =
           *(undefined4 *)((long)paVar7 + lVar8 + -0x14);
      paVar7 = (list->l).list.attributes;
      puVar2 = (undefined8 *)((long)paVar7 + lVar8 + -0x10);
      uVar5 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(paVar7->value).u + lVar8);
      *puVar3 = *puVar2;
      puVar3[1] = uVar5;
      paVar7 = (list->l).list.attributes;
      lVar8 = lVar8 + -0x18;
    }
    uVar9 = 0;
LAB_00104788:
    uVar9 = uVar9 & 0xffffffff;
    paVar7[uVar9].attr_id = attr_id;
    (list->l).list.attributes[uVar9].val_type = val_type;
    paVar7 = (list->l).list.attributes;
    paVar7[uVar9].value.u.l = (ssize_t)value.u.d;
    paVar7[uVar9].value.u.o.buffer = value.u._8_8_;
    puVar1 = &((list->l).list.iattrs)->other_attr_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return 1;
}

Assistant:

extern int
add_pattr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_union value)
{
    int i;
    if (val_type == Attr_Int4) {
	int count = list->l.list.iattrs->int_attr_count;
	if (count > 0) {
	    int size = sizeof(struct int_attr_struct) + 
		(count+2)* sizeof(int_attr);
	    list->l.list.iattrs = realloc(list->l.list.iattrs, size);
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.iattrs->iattr[i].attr_id > attr_id) {
		list->l.list.iattrs->iattr[i+1].attr_id = list->l.list.iattrs->iattr[i].attr_id;
		list->l.list.iattrs->iattr[i+1].value = list->l.list.iattrs->iattr[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.iattrs->iattr[i+1].attr_id = attr_id;
	list->l.list.iattrs->iattr[i+1].value = (int4) (long) value.u.i;
	list->l.list.iattrs->int_attr_count++;
    } else {
	int count = list->l.list.iattrs->other_attr_count;
	if (count == 0) {
	    list->l.list.attributes = (attr_p) malloc(sizeof(attr));
	} else {	    
	    list->l.list.attributes = (attr_p) realloc(list->l.list.attributes,
						       sizeof(attr)*(count+1));
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.attributes[i].attr_id > attr_id) {
		list->l.list.attributes[i+1].attr_id = list->l.list.attributes[i].attr_id;
		list->l.list.attributes[i+1].val_type = list->l.list.attributes[i].val_type;
		list->l.list.attributes[i+1].value = list->l.list.attributes[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.attributes[i+1].attr_id = attr_id;
	list->l.list.attributes[i+1].val_type = val_type;
	list->l.list.attributes[i+1].value = value;
	list->l.list.iattrs->other_attr_count++;
    }
    return 1;
}